

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

any cs_impl::any::make_protect<cs::callable,cs::function&>(function *args)

{
  holder<cs::callable> *args_1;
  proxy *dat;
  allocator_type<cs_impl::any::proxy,_512UL,_cs_impl::default_allocator_provider> *in_RSI;
  function *in_RDI;
  function *args_2;
  allocator_type<cs_impl::any::holder<cs::callable>,_64UL,_cs_impl::default_allocator_provider>
  *in_stack_ffffffffffffffe0;
  undefined4 uVar1;
  undefined4 uVar2;
  
  uVar2 = 1;
  uVar1 = 1;
  args_2 = in_RDI;
  args_1 = cs::
           allocator_type<cs_impl::any::holder<cs::callable>,64ul,cs_impl::default_allocator_provider>
           ::alloc<cs::function&>(in_stack_ffffffffffffffe0,in_RDI);
  dat = cs::allocator_type<cs_impl::any::proxy,512ul,cs_impl::default_allocator_provider>::
        alloc<int,int,cs_impl::any::holder<cs::callable>*>
                  (in_RSI,(int *)CONCAT44(uVar2,uVar1),(int *)args_1,(holder<cs::callable> **)args_2
                  );
  any((any *)in_RDI,dat);
  return (any)(proxy *)args_2;
}

Assistant:

static any make_protect(ArgsT &&...args)
		{
			return any(allocator.alloc(1, 1, holder<T>::allocator.alloc(std::forward<ArgsT>(args)...)));
		}